

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

void json_throw_parse_error(lua_State *l,json_parse_t *json,char *exp,json_token_t *token)

{
  char *local_30;
  char *found;
  json_token_t *token_local;
  char *exp_local;
  json_parse_t *json_local;
  lua_State *l_local;
  
  strbuf_free(json->tmp);
  if (token->type == T_ERROR) {
    local_30 = (token->value).string;
  }
  else {
    local_30 = json_token_type_name[token->type];
  }
  luaL_error(l,"Expected %s but found %s at character %d",exp,local_30,(ulong)(token->index + 1));
  return;
}

Assistant:

static void json_throw_parse_error(lua_State *l, json_parse_t *json,
                                   const char *exp, json_token_t *token)
{
    const char *found;

    strbuf_free(json->tmp);

    if (token->type == T_ERROR)
        found = token->value.string;
    else
        found = json_token_type_name[token->type];

    /* Note: token->index is 0 based, display starting from 1 */
    luaL_error(l, "Expected %s but found %s at character %d",
               exp, found, token->index + 1);
}